

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCallTransitions.cpp
# Opt level: O1

void BubbleSortArray(NULLCArray arr,NULLCFuncPtr comparator)

{
  undefined4 uVar1;
  uint uVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar6 = arr.len;
  if (uVar6 != 0) {
    uVar8 = uVar6 - 1;
    uVar9 = (ulong)uVar8;
    uVar5 = (ulong)(uVar6 - 2);
    uVar7 = 0;
    uVar2 = uVar8;
    pcVar3 = arr.ptr;
    do {
      for (; uVar7 < uVar2; uVar2 = uVar2 - 1) {
        nullcCallFunction(comparator.context,(ulong)comparator.id,
                          (ulong)*(uint *)(pcVar3 + uVar9 * 4),(ulong)*(uint *)(pcVar3 + uVar5 * 4))
        ;
        iVar4 = nullcGetResultInt();
        if (iVar4 != 0) {
          uVar1 = *(undefined4 *)(pcVar3 + uVar9 * 4);
          *(undefined4 *)(pcVar3 + uVar9 * 4) = *(undefined4 *)(pcVar3 + uVar5 * 4);
          *(undefined4 *)(pcVar3 + uVar5 * 4) = uVar1;
        }
        pcVar3 = pcVar3 + -4;
      }
      uVar7 = uVar7 + 1;
      uVar2 = uVar8;
      pcVar3 = arr.ptr;
    } while (uVar7 != uVar6);
  }
  return;
}

Assistant:

void BubbleSortArray(NULLCArray arr, NULLCFuncPtr comparator)
{
	int *elem = (int*)arr.ptr;

	for(unsigned int k = 0; k < arr.len; k++)
	{
		for(unsigned int l = arr.len-1; l > k; l--)
		{
			nullcCallFunction(comparator, elem[l], elem[l-1]);
			if(nullcGetResultInt())
			{
				int tmp = elem[l];
				elem[l] = elem[l-1];
				elem[l-1] = tmp;
			}
		}
	}
}